

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

mcu8str * mctools_real_path(mcu8str *__return_storage_ptr__,mcu8str *rawpath)

{
  char *pcVar1;
  char *__ptr;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  mcu8str path;
  mcu8str s_1;
  char buf [4096];
  mcu8str local_1060;
  mcu8str local_1048;
  mcu8str local_1030;
  char local_1018 [4096];
  
  pcVar1 = rawpath->c_str;
  uVar4 = rawpath->size;
  local_1060.buflen = uVar4 + 1;
  local_1060.owns_memory = 0;
  local_1060.c_str = pcVar1;
  local_1060.size = uVar4;
  iVar2 = mctools_impl_has_winnamespace(rawpath);
  if (iVar2 != 0) {
    local_1060.c_str = pcVar1 + 4;
    uVar4 = uVar4 - 4;
    local_1060.size = uVar4;
  }
  if (uVar4 != 0) {
    local_1030.owns_memory = 0;
    local_1030.c_str = local_1018;
    local_1018[0] = '\0';
    local_1030.size = 0;
    local_1030.buflen = 0x1000;
    mcu8str_assign(&local_1030,&local_1060);
    mctools_pathseps_platform(&local_1030);
    mcu8str_create(&local_1048,0x1000);
    __ptr = local_1030.c_str;
    pcVar1 = local_1048.c_str;
    pcVar3 = realpath(local_1030.c_str,local_1048.c_str);
    if (pcVar3 != (char *)0x0) {
      if (__ptr != (char *)0x0 && local_1030.owns_memory != 0) {
        free(__ptr);
      }
      mcu8str_update_size(&local_1048);
      mctools_pathseps_platform(&local_1048);
      *(ulong *)&__return_storage_ptr__->owns_memory =
           CONCAT44(local_1048._20_4_,local_1048.owns_memory);
      __return_storage_ptr__->c_str = local_1048.c_str;
      __return_storage_ptr__->size = local_1048.size;
      __return_storage_ptr__->buflen = local_1048.buflen;
      return __return_storage_ptr__;
    }
    if (pcVar1 != (char *)0x0 && local_1048.owns_memory != 0) {
      free(pcVar1);
    }
    if (__ptr != (char *)0x0 && local_1030.owns_memory != 0) {
      free(__ptr);
    }
  }
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_real_path( const mcu8str* rawpath )
  {
    //NB: Might return empty in case of errors.
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return mcu8str_create_empty();

#ifdef MC_IS_WINDOWS
    //To resolve symlinks we must open a file handle with CreateFileW. If it
    //fails, we revert back to at least returning an absolute path.
    mcwinstr wpath = mc_path2wpath( &path );
    DWORD share = FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE;
    DWORD access = FILE_READ_ATTRIBUTES;
    DWORD flags = FILE_FLAG_BACKUP_SEMANTICS;
    HANDLE fh1 = CreateFileW( wpath.c_str, access, share, NULL,
                              OPEN_EXISTING, flags, NULL );
    if ( fh1 == INVALID_HANDLE_VALUE ) {
      //Failed to open. This can happen for a variety of reasons. As a fallback
      //option, we return the full path (which won't resolve symlinks):
      mcu8str output = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc( &wpath );
      return output;
    }

    //We have an open handle fh1, use it to find the resolved path:
    mcwinstr resolvedpath = mc_winstr_create(4096);
    DWORD len = GetFinalPathNameByHandleW( fh1, resolvedpath.c_str,
                                           (DWORD)resolvedpath.buflen, 0 );
    if ( (mcu8str_size_t)len >= resolvedpath.buflen ) {
      //Too short buffer, try again:
      mc_winstr_dealloc(&resolvedpath);
      resolvedpath = mc_winstr_create(len);
      len = GetFinalPathNameByHandleW( fh1, resolvedpath.c_str,
                                       (DWORD)resolvedpath.buflen, 0 );
    }
    //Close the open file handle:
    CloseHandle( fh1 );
    if ( len == 0 || (mcu8str_size_t)len >= resolvedpath.buflen ) {
      //Failure, fall-back to unresolved absolute path:
      mc_winstr_dealloc(&resolvedpath);
      mcu8str output = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc( &wpath );
      return output;
    }
    mc_winstr_dealloc( &wpath );
    resolvedpath.c_str[len] = 0;
    resolvedpath.size = len;
    //All ok, get rid of any 8.3-form path names and return:
    mcwinstr woutput = mc_impl_expand_wpath_to_longpathname( &resolvedpath );
    mc_winstr_dealloc(&resolvedpath);
    mcu8str output = mc_winstr_to_u8str( &woutput );
    mc_winstr_dealloc( &woutput );
    if ( mctools_impl_has_winnamespace( &output ) ) {
      mcu8str tmp = mctools_impl_view_no_winnamespace( &output );
      mcu8str_ensure_dynamic_buffer(&tmp);
      mcu8str_swap( &tmp, &output );
      mcu8str_dealloc(&tmp);
    }
#else
    char buf[4096];
    mcu8str native = mcu8str_create_from_staticbuffer( buf, sizeof(buf) );
    mcu8str_assign( &native, &path );
    mctools_pathseps_platform( &native );
    mcu8str output = mcu8str_create( PATH_MAX );
    if ( !realpath( native.c_str, output.c_str ) ) {
      //failure
      mcu8str_dealloc(&output);
      mcu8str_dealloc(&native);
      return mcu8str_create_empty();
    }
    mcu8str_dealloc(&native);
    mcu8str_update_size(&output);
#endif
    mctools_pathseps_platform(&output);
    return output;
  }